

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

bool __thiscall
slang::ast::DiagnosticVisitor::handleDefault<slang::ast::PrimitivePortSymbol>
          (DiagnosticVisitor *this,PrimitivePortSymbol *symbol)

{
  bool bVar1;
  DeclaredType *pDVar2;
  PrimitivePortSymbol *in_RSI;
  DiagnosticVisitor *in_RDI;
  not_null<const_slang::ast::DeclaredType_*> declaredType;
  DeclaredType *in_stack_00000020;
  DeclaredType *in_stack_00000050;
  undefined1 local_1;
  
  bVar1 = finishedEarly(in_RDI);
  if (bVar1) {
    local_1 = false;
  }
  else {
    ValueSymbol::getDeclaredType((ValueSymbol *)in_RDI);
    pDVar2 = not_null::operator_cast_to_DeclaredType_
                       ((not_null<const_slang::ast::DeclaredType_*> *)0x5bc7c2);
    if (pDVar2 != (DeclaredType *)0x0) {
      not_null<const_slang::ast::DeclaredType_*>::operator->
                ((not_null<const_slang::ast::DeclaredType_*> *)0x5bc7d2);
      DeclaredType::getType(in_stack_00000050);
      not_null<const_slang::ast::DeclaredType_*>::operator->
                ((not_null<const_slang::ast::DeclaredType_*> *)0x5bc7e4);
      DeclaredType::getInitializer(in_stack_00000020);
    }
    ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false>::
    visitDefault<slang::ast::PrimitivePortSymbol>
              ((ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false> *)in_RDI,
               in_RSI);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool handleDefault(const T& symbol) {
        if (finishedEarly())
            return false;

        if constexpr (std::is_base_of_v<Symbol, T>) {
            auto declaredType = symbol.getDeclaredType();
            if (declaredType) {
                declaredType->getType();
                declaredType->getInitializer();
            }

            if constexpr (std::is_same_v<EnumValueSymbol, T> ||
                          std::is_same_v<SpecparamSymbol, T>) {
                symbol.getValue();
            }
        }

        if constexpr (requires { symbol.getBody().bad(); }) {
            auto& body = symbol.getBody();
            if (body.bad())
                return true;

            body.visit(*this);
        }

        visitDefault(symbol);
        return true;
    }